

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O1

void __thiscall cbtCollisionWorld::performDiscreteCollisionDetection(cbtCollisionWorld *this)

{
  cbtDispatcher *pcVar1;
  int iVar2;
  rep_conflict rVar3;
  long lVar4;
  undefined4 extraout_var;
  CProfileSample __profile_2;
  CProfileSample __profile_1;
  CProfileSample __profile;
  CProfileSample local_13;
  CProfileSample local_12;
  CProfileSample local_11;
  
  CProfileSample::CProfileSample(&local_11,"performDiscreteCollisionDetection");
  (*this->_vptr_cbtCollisionWorld[2])(this);
  CProfileSample::CProfileSample(&local_12,"computeOverlappingPairs");
  chrono::utils::ChProfileManager::Start_Profile("Broad-phase");
  rVar3 = std::chrono::_V2::system_clock::now();
  (this->timer_collision_broad).m_start.__d.__r = rVar3;
  (*this->_vptr_cbtCollisionWorld[3])(this);
  lVar4 = std::chrono::_V2::system_clock::now();
  (this->timer_collision_broad).m_end.__d.__r = lVar4;
  (this->timer_collision_broad).m_total.__r =
       (double)(lVar4 - (this->timer_collision_broad).m_start.__d.__r) / 1000000000.0 +
       (this->timer_collision_broad).m_total.__r;
  chrono::utils::ChProfileManager::Stop_Profile();
  CProfileSample::~CProfileSample(&local_12);
  pcVar1 = this->m_dispatcher1;
  CProfileSample::CProfileSample(&local_13,"dispatchAllCollisionPairs");
  chrono::utils::ChProfileManager::Start_Profile("Narrow-phase");
  rVar3 = std::chrono::_V2::system_clock::now();
  (this->timer_collision_narrow).m_start.__d.__r = rVar3;
  if (pcVar1 != (cbtDispatcher *)0x0) {
    iVar2 = (*this->m_broadphasePairCache->_vptr_cbtBroadphaseInterface[9])();
    (*pcVar1->_vptr_cbtDispatcher[8])
              (pcVar1,CONCAT44(extraout_var,iVar2),&this->m_dispatchInfo,this->m_dispatcher1);
  }
  lVar4 = std::chrono::_V2::system_clock::now();
  (this->timer_collision_narrow).m_end.__d.__r = lVar4;
  (this->timer_collision_narrow).m_total.__r =
       (double)(lVar4 - (this->timer_collision_narrow).m_start.__d.__r) / 1000000000.0 +
       (this->timer_collision_narrow).m_total.__r;
  chrono::utils::ChProfileManager::Stop_Profile();
  CProfileSample::~CProfileSample(&local_13);
  CProfileSample::~CProfileSample(&local_11);
  return;
}

Assistant:

void cbtCollisionWorld::performDiscreteCollisionDetection()
{
	BT_PROFILE("performDiscreteCollisionDetection");

	cbtDispatcherInfo& dispatchInfo = getDispatchInfo();

	updateAabbs();

	{
        /* ***CHRONO*** Add Chrono-specific timers */
		BT_PROFILE("computeOverlappingPairs");
        CH_PROFILE("Broad-phase");
        timer_collision_broad.start();
		computeOverlappingPairs();
        timer_collision_broad.stop();
	}

	cbtDispatcher* dispatcher = getDispatcher();
	{
        /* ***CHRONO*** Add Chrono-specific timers */
        BT_PROFILE("dispatchAllCollisionPairs");
		CH_PROFILE("Narrow-phase");
        timer_collision_narrow.start();
		if (dispatcher)
			dispatcher->dispatchAllCollisionPairs(m_broadphasePairCache->getOverlappingPairCache(), dispatchInfo, m_dispatcher1);
		timer_collision_narrow.stop();
	}
}